

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall UnsignedShort_UnsignedTest_Test::TestBody(UnsignedShort_UnsignedTest_Test *this)

{
  ParamType *pPVar1;
  ScopedTrace local_11;
  UnsignedShort_UnsignedTest_Test *pUStack_10;
  ScopedTrace gtest_trace_229;
  UnsignedShort_UnsignedTest_Test *this_local;
  
  pUStack_10 = this;
  testing::ScopedTrace::ScopedTrace
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0xe5,"UnsignedShort");
  pPVar1 = testing::WithParamInterface<unsigned_short>::GetParam();
  anon_unknown.dwarf_131826::check<unsigned_short>(*pPVar1);
  testing::ScopedTrace::~ScopedTrace(&local_11);
  return;
}

Assistant:

TEST_P (UnsignedShort, UnsignedTest) {
    SCOPED_TRACE ("UnsignedShort");
    check (GetParam ());
}